

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O0

Cut_Cut_t *
Cut_OracleComputeCuts(Cut_Oracle_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1)

{
  int iVar1;
  int i_00;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Cut_Cut_t *pCVar5;
  Cut_Cut_t *Entry_00;
  Cut_Cut_t *pCut0_00;
  Cut_Cut_t *pCut1_00;
  void *pvVar6;
  abctime aVar7;
  abctime clk;
  int Entry;
  int i;
  int nCuts;
  int iCutStart;
  Cut_Cut_t *pList1;
  Cut_Cut_t *pList0;
  Cut_Cut_t *pCut1;
  Cut_Cut_t *pCut0;
  Cut_Cut_t *pCut;
  Cut_Cut_t **ppTail;
  Cut_Cut_t *pList;
  int fCompl1_local;
  int fCompl0_local;
  int Node1_local;
  int Node0_local;
  int Node_local;
  Cut_Oracle_t *p_local;
  
  aVar4 = Abc_Clock();
  pCut0 = (Cut_Cut_t *)Vec_PtrEntry(p->vCutsNew,Node0);
  pCVar5 = (Cut_Cut_t *)Vec_PtrEntry(p->vCutsNew,Node1);
  if ((pCut0 == (Cut_Cut_t *)0x0) || (pCVar5 == (Cut_Cut_t *)0x0)) {
    __assert_fail("pList0 && pList1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutOracle.c"
                  ,0x14a,"Cut_Cut_t *Cut_OracleComputeCuts(Cut_Oracle_t *, int, int, int, int, int)"
                 );
  }
  p->fSimul = (fCompl0 ^ *(uint *)pCut0 >> 0x16 & 1) & (fCompl1 ^ *(uint *)pCVar5 >> 0x16 & 1);
  Vec_PtrClear(p->vCuts0);
  for (; pCut0 != (Cut_Cut_t *)0x0; pCut0 = pCut0->pNext) {
    Vec_PtrPush(p->vCuts0,pCut0);
  }
  Vec_PtrClear(p->vCuts1);
  for (pCut0 = pCVar5; pCut0 != (Cut_Cut_t *)0x0; pCut0 = pCut0->pNext) {
    Vec_PtrPush(p->vCuts1,pCut0);
  }
  iVar1 = Vec_IntEntry(p->vNodeCuts,Node);
  i_00 = Vec_IntEntry(p->vNodeStarts,Node);
  iVar2 = Vec_IntEntry(p->vCutPairs,i_00);
  if (iVar2 == 0) {
    Entry_00 = Cut_CutTriv(p,Node);
    pCVar5 = Entry_00;
    for (clk._4_4_ = 1; pCut = (Cut_Cut_t *)&pCVar5->pNext, clk._4_4_ < iVar1;
        clk._4_4_ = clk._4_4_ + 1) {
      uVar3 = Vec_IntEntry(p->vCutPairs,i_00 + clk._4_4_);
      pCut0_00 = (Cut_Cut_t *)Vec_PtrEntry(p->vCuts0,uVar3 & 0xffff);
      pCut1_00 = (Cut_Cut_t *)Vec_PtrEntry(p->vCuts1,(int)uVar3 >> 0x10);
      pCVar5 = Cut_CutMerge(p,pCut0_00,pCut1_00);
      *(Cut_Cut_t **)pCut = pCVar5;
      if (p->pParams->fTruth != 0) {
        Cut_TruthComputeOld(pCVar5,pCut0_00,pCut1_00,fCompl0,fCompl1);
      }
    }
    *(undefined8 *)pCut = 0;
    pvVar6 = Vec_PtrEntry(p->vCutsNew,Node);
    if (pvVar6 == (void *)0x0) {
      Vec_PtrWriteEntry(p->vCutsNew,Node,Entry_00);
      aVar7 = Abc_Clock();
      p->timeTotal = (aVar7 - aVar4) + p->timeTotal;
      return Entry_00;
    }
    __assert_fail("Vec_PtrEntry( p->vCutsNew, Node ) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutOracle.c"
                  ,0x170,"Cut_Cut_t *Cut_OracleComputeCuts(Cut_Oracle_t *, int, int, int, int, int)"
                 );
  }
  __assert_fail("Vec_IntEntry(p->vCutPairs, iCutStart) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutOracle.c"
                ,0x15c,"Cut_Cut_t *Cut_OracleComputeCuts(Cut_Oracle_t *, int, int, int, int, int)");
}

Assistant:

Cut_Cut_t * Cut_OracleComputeCuts( Cut_Oracle_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1 )
{
    Cut_Cut_t * pList = NULL, ** ppTail = &pList;
    Cut_Cut_t * pCut, * pCut0, * pCut1, * pList0, * pList1;
    int iCutStart, nCuts, i, Entry;
    abctime clk = Abc_Clock();

    // get the cuts of the children
    pList0 = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsNew, Node0 );
    pList1 = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsNew, Node1 );
    assert( pList0 && pList1 );

    // get the complemented attribute of the cut
    p->fSimul = (fCompl0 ^ pList0->fSimul) & (fCompl1 ^ pList1->fSimul);

    // collect the cuts
    Vec_PtrClear( p->vCuts0 );
    Cut_ListForEachCut( pList0, pCut )
        Vec_PtrPush( p->vCuts0, pCut );
    Vec_PtrClear( p->vCuts1 );
    Cut_ListForEachCut( pList1, pCut )
        Vec_PtrPush( p->vCuts1, pCut );

    // get the first and last cuts of this node
    nCuts = Vec_IntEntry(p->vNodeCuts, Node);
    iCutStart = Vec_IntEntry(p->vNodeStarts, Node);

    // create trivial cut
    assert( Vec_IntEntry(p->vCutPairs, iCutStart) == 0 );
    pCut = Cut_CutTriv( p, Node );
    *ppTail = pCut;
    ppTail = &pCut->pNext;
    // create other cuts
    for ( i = 1; i < nCuts; i++ )
    {
        Entry = Vec_IntEntry( p->vCutPairs, iCutStart + i );
        pCut0 = (Cut_Cut_t *)Vec_PtrEntry( p->vCuts0, Entry & 0xFFFF );
        pCut1 = (Cut_Cut_t *)Vec_PtrEntry( p->vCuts1, Entry >> 16 );
        pCut  = Cut_CutMerge( p, pCut0, pCut1 );
        *ppTail = pCut;
        ppTail = &pCut->pNext;
        // compute the truth table
        if ( p->pParams->fTruth )
            Cut_TruthComputeOld( pCut, pCut0, pCut1, fCompl0, fCompl1 );
    }
    *ppTail = NULL;

    // write the new cut
    assert( Vec_PtrEntry( p->vCutsNew, Node ) == NULL );
    Vec_PtrWriteEntry( p->vCutsNew, Node, pList );
p->timeTotal += Abc_Clock() - clk;
    return pList;
}